

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_rust.cpp
# Opt level: O0

string * __thiscall
flatbuffers::rust::RustGenerator::NamespacedNativeName_abi_cxx11_
          (string *__return_storage_ptr__,RustGenerator *this,StructDef *def)

{
  Namespace *ns;
  string local_40;
  StructDef *local_20;
  StructDef *def_local;
  RustGenerator *this_local;
  
  ns = (def->super_Definition).defined_namespace;
  local_20 = def;
  def_local = (StructDef *)this;
  this_local = (RustGenerator *)__return_storage_ptr__;
  IdlNamer::ObjectType_abi_cxx11_(&local_40,&this->namer_,def);
  WrapInNameSpace(__return_storage_ptr__,this,ns,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string NamespacedNativeName(const StructDef &def) {
    return WrapInNameSpace(def.defined_namespace, namer_.ObjectType(def));
  }